

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O0

void __thiscall ThreadServiceWrapperBase::ThreadServiceWrapperBase(ThreadServiceWrapperBase *this)

{
  ThreadServiceWrapperBase *this_local;
  
  ThreadServiceWrapper::ThreadServiceWrapper(&this->super_ThreadServiceWrapper);
  (this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper =
       (_func_int **)&PTR_ScheduleNextCollectOnExit_01de4000;
  this->threadContext = (ThreadContext *)0x0;
  this->inIdleCollect = false;
  this->needIdleCollect = false;
  this->forceIdleCollectOnce = false;
  this->hasScheduledIdleCollect = false;
  this->shouldScheduleIdleCollectOnExitIdle = false;
  return;
}

Assistant:

ThreadServiceWrapperBase::ThreadServiceWrapperBase() :
    threadContext(nullptr),
    needIdleCollect(false),
    inIdleCollect(false),
    hasScheduledIdleCollect(false),
    shouldScheduleIdleCollectOnExitIdle(false),
    forceIdleCollectOnce(false)
{
}